

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O2

void __thiscall sf2cute::SoundFontWriter::Write(SoundFontWriter *this,ostream *out)

{
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>,std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>>
  *this_00;
  RIFF riff;
  _Head_base<0UL,_sf2cute::RIFFChunkInterface_*,_false> local_80;
  string local_78;
  undefined1 local_58 [64];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"sfbk",(allocator<char> *)&local_80);
  RIFF::RIFF((RIFF *)local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  MakeInfoListChunk((SoundFontWriter *)&local_80);
  this_00 = (vector<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>,std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>>
             *)(local_58 + 0x28);
  std::
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>,std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>>
  ::
  emplace_back<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>
            (this_00,(unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                      *)&local_80);
  if (local_80._M_head_impl != (RIFFChunkInterface *)0x0) {
    (*(local_80._M_head_impl)->_vptr_RIFFChunkInterface[1])();
  }
  MakeSdtaListChunk((SoundFontWriter *)&local_80);
  std::
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>,std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>>
  ::
  emplace_back<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>
            (this_00,(unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                      *)&local_80);
  if (local_80._M_head_impl != (RIFFChunkInterface *)0x0) {
    (*(local_80._M_head_impl)->_vptr_RIFFChunkInterface[1])();
  }
  MakePdtaListChunk((SoundFontWriter *)&local_80);
  std::
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>,std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>>
  ::
  emplace_back<std::unique_ptr<sf2cute::RIFFChunkInterface,std::default_delete<sf2cute::RIFFChunkInterface>>>
            (this_00,(unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                      *)&local_80);
  if (local_80._M_head_impl != (RIFFChunkInterface *)0x0) {
    (*(local_80._M_head_impl)->_vptr_RIFFChunkInterface[1])();
  }
  RIFF::Write((RIFF *)local_58,out);
  RIFF::~RIFF((RIFF *)local_58);
  return;
}

Assistant:

void SoundFontWriter::Write(std::ostream & out) {
  RIFF riff("sfbk");
  riff.AddChunk(MakeInfoListChunk());
  riff.AddChunk(MakeSdtaListChunk());
  riff.AddChunk(MakePdtaListChunk());
  riff.Write(out);
}